

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O3

bool __thiscall
Rml::DecoratorTiledInstancer::GetTileProperties
          (DecoratorTiledInstancer *this,Tile *tiles,Texture *textures,size_t num_tiles_and_textures
          ,PropertyDictionary *properties,DecoratorInstancerInterface *instancer_interface)

{
  Vector2Type VVar1;
  Vector2Type VVar2;
  Unit UVar3;
  Spritesheet *pSVar4;
  code *pcVar5;
  float fVar6;
  PropertyDictionary *this_00;
  ulong uVar7;
  Tile *pTVar8;
  bool bVar9;
  PropertyId id;
  bool bVar10;
  byte bVar11;
  int iVar12;
  Property *pPVar13;
  Sprite *pSVar14;
  RenderManager *render_manager;
  Property *pPVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  pointer pTVar20;
  Property *property;
  Texture *this_01;
  Vector2f VVar21;
  Texture TVar22;
  String texture_name;
  String previous_texture_name;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  PropertyDictionary *local_f0;
  DecoratorInstancerInterface *local_e8;
  undefined8 local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  RenderManager *local_a0;
  pointer local_98;
  size_t local_90;
  ulong local_88;
  undefined1 *local_80;
  size_t local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  Tile *local_60;
  Texture *local_58;
  DecoratorTiledInstancer *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_e8 = instancer_interface;
  local_90 = num_tiles_and_textures;
  local_60 = tiles;
  local_58 = textures;
  local_50 = this;
  if ((((long)(this->tile_property_ids).
              super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->tile_property_ids).
             super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
             ._M_impl.super__Vector_impl_data._M_start) * -0x3333333333333333 -
       num_tiles_and_textures != 0) &&
     (bVar9 = Assert("RMLUI_ASSERT(num_tiles_and_textures == tile_property_ids.size())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorTiled.cpp"
                     ,0x11f), !bVar9)) {
LAB_00211b32:
    pcVar5 = (code *)invalidInstructionException();
    (*pcVar5)();
  }
  local_80 = &local_70;
  local_78 = 0;
  local_70 = 0;
  if (local_90 == 0) {
    bVar11 = 1;
  }
  else {
    local_48 = 0xffffffffffffffff;
    uStack_40 = 0xffffffffffffffff;
    local_e0 = 0;
    uVar18 = 0;
    local_a0 = (RenderManager *)0x0;
    local_f0 = properties;
    do {
      pTVar20 = (local_50->tile_property_ids).
                super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar13 = PropertyDictionary::GetProperty(local_f0,pTVar20[uVar18].src);
      local_88 = uVar18;
      Property::Get<std::__cxx11::string>(&local_d8,pPVar13);
      bVar9 = false;
      if ((local_d8._M_string_length != 0) &&
         (iVar12 = ::std::__cxx11::string::compare((char *)&local_d8), iVar12 != 0)) {
        pSVar14 = DecoratorInstancerInterface::GetSprite(local_e8,&local_d8);
        pTVar8 = local_60;
        uVar7 = local_88;
        this_01 = local_58 + local_88;
        if (pSVar14 == (Sprite *)0x0) {
          if ((local_d8._M_string_length == local_78) &&
             ((local_d8._M_string_length == 0 ||
              (iVar12 = bcmp(local_d8._M_dataplus._M_p,local_80,local_d8._M_string_length),
              iVar12 == 0)))) {
            this_01->render_manager = local_a0;
            this_01->file_index = (undefined4)local_48;
            this_01->callback_index = local_48._4_4_;
          }
          else {
            TVar22 = DecoratorInstancerInterface::GetTexture(local_e8,&local_d8);
            *this_01 = TVar22;
            bVar10 = Texture::operator_cast_to_bool(this_01);
            bVar9 = true;
            if (!bVar10) goto LAB_00211a8f;
            ::std::__cxx11::string::_M_assign((string *)&local_80);
            local_a0 = this_01->render_manager;
            local_48._0_4_ = this_01->file_index;
            local_48._4_4_ = this_01->callback_index;
            uStack_40 = 0;
          }
        }
        else {
          fVar6 = (pSVar14->rectangle).p0.y;
          local_60[local_88].position.x = (pSVar14->rectangle).p0.x;
          local_60[local_88].position.y = fVar6;
          VVar1 = (pSVar14->rectangle).p0;
          VVar2 = (pSVar14->rectangle).p1;
          VVar21.x = VVar2.x - VVar1.x;
          VVar21.y = VVar2.y - VVar1.y;
          local_60[local_88].size = VVar21;
          pSVar4 = pSVar14->sprite_sheet;
          local_60[local_88].display_scale = pSVar4->display_scale;
          render_manager = DecoratorInstancerInterface::GetRenderManager(local_e8);
          TVar22 = TextureSource::GetTexture(&pSVar4->texture_source,render_manager);
          *this_01 = TVar22;
        }
        pTVar20 = pTVar20 + uVar18;
        id = pTVar20->fit;
        if (id != Invalid) {
          if ((pTVar20->align_x == Invalid) || (pTVar20->align_y == Invalid)) {
            bVar9 = Assert("RMLUI_ASSERT(ids.align_x != PropertyId::Invalid && ids.align_y != PropertyId::Invalid)"
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorTiled.cpp"
                           ,0x159);
            if (!bVar9) goto LAB_00211b32;
            id = pTVar20->fit;
          }
          pPVar13 = PropertyDictionary::GetProperty(local_f0,id);
          local_110._0_4_ = 0.0;
          Variant::GetInto<int,_0>(&pPVar13->value,(int *)local_110);
          this_00 = local_f0;
          pTVar8[uVar7].fit_mode = local_110._0_4_;
          if (local_110._0_4_ - REPEAT < 3 && pSVar14 != (Sprite *)0x0) {
            Property::ToString_abi_cxx11_((String *)local_110,pPVar13);
            Log::Message(LT_WARNING,
                         "Decorator \'fit\' value is \'%s\', which is incompatible with sprites",
                         CONCAT44(local_110._4_4_,local_110._0_4_));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_110._4_4_,local_110._0_4_) != &local_100) {
              operator_delete((float *)CONCAT44(local_110._4_4_,local_110._0_4_),
                              local_100._M_allocated_capacity + 1);
            }
            bVar9 = true;
            goto LAB_00211a8f;
          }
          pPVar13 = PropertyDictionary::GetProperty(local_f0,pTVar20->align_x);
          pPVar15 = PropertyDictionary::GetProperty(this_00,pTVar20->align_y);
          lVar19 = 0;
          bVar9 = true;
          local_98 = pTVar20;
          do {
            bVar10 = bVar9;
            UVar3 = pPVar13->unit;
            if (UVar3 == PX) {
              local_110._0_4_ = 0.0;
              Variant::GetInto<float,_0>(&pPVar13->value,(float *)local_110);
              uVar17 = local_a4 & 0xffffff00;
              local_a4 = uVar17;
LAB_002119a4:
              *(uint *)(pTVar8[uVar7].align + lVar19) = uVar17;
              pTVar8[uVar7].align[lVar19].value = (float)local_110._0_4_;
            }
            else {
              if (UVar3 == PERCENT) {
                local_110._0_4_ = 0.0;
                Variant::GetInto<float,_0>(&pPVar13->value,(float *)local_110);
                uVar17 = (local_a8 & 0xffffff00) + 1;
                local_a8 = uVar17;
                goto LAB_002119a4;
              }
              if (UVar3 == KEYWORD) {
                local_110._0_4_ = 0.0;
                Variant::GetInto<int,_0>(&pPVar13->value,(int *)local_110);
                if ((float)local_110._0_4_ == 0.0) {
                  local_b4 = (local_b4 & 0xffffff00) + 1;
                  *(uint *)(pTVar8[uVar7].align + lVar19) = local_b4;
                  pTVar8[uVar7].align[lVar19].value = 0.0;
                }
                else if ((float)local_110._0_4_ == 1.4013e-45) {
                  local_b0 = (local_b0 & 0xffffff00) + 1;
                  *(uint *)(pTVar8[uVar7].align + lVar19) = local_b0;
                  pTVar8[uVar7].align[lVar19].value = 50.0;
                }
                else if ((float)local_110._0_4_ == 2.8026e-45) {
                  local_ac = (local_ac & 0xffffff00) + 1;
                  *(uint *)(pTVar8[uVar7].align + lVar19) = local_ac;
                  pTVar8[uVar7].align[lVar19].value = 100.0;
                }
              }
              else {
                Property::ToString_abi_cxx11_((String *)local_110,pPVar13);
                Log::Message(LT_WARNING,
                             "Decorator alignment value is \'%s\' which uses an unsupported unit (use px, %%, or keyword)"
                             ,CONCAT44(local_110._4_4_,local_110._0_4_));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_110._4_4_,local_110._0_4_) != &local_100) {
                  operator_delete((float *)CONCAT44(local_110._4_4_,local_110._0_4_),
                                  local_100._M_allocated_capacity + 1);
                }
              }
            }
            lVar19 = 1;
            pPVar13 = pPVar15;
            bVar9 = false;
            pTVar20 = local_98;
          } while (bVar10);
        }
        local_98 = pTVar20;
        bVar9 = false;
        if (local_98->orientation != Invalid) {
          pPVar13 = PropertyDictionary::GetProperty(local_f0,local_98->orientation);
          local_110._0_4_ = 0.0;
          Variant::GetInto<int,_0>(&pPVar13->value,(int *)local_110);
          pTVar8[uVar7].orientation = local_110._0_4_;
        }
      }
LAB_00211a8f:
      paVar16 = &local_d8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar16) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        paVar16 = extraout_RAX;
      }
      if (bVar9) break;
      uVar18 = local_88 + 1;
      local_e0 = CONCAT71((int7)((ulong)paVar16 >> 8),local_90 <= uVar18);
    } while (uVar18 != local_90);
    if (local_80 != &local_70) {
      operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
    }
    bVar11 = (byte)local_e0;
  }
  return (bool)(bVar11 & 1);
}

Assistant:

bool DecoratorTiledInstancer::GetTileProperties(DecoratorTiled::Tile* tiles, Texture* textures, size_t num_tiles_and_textures,
	const PropertyDictionary& properties, const DecoratorInstancerInterface& instancer_interface) const
{
	RMLUI_ASSERT(num_tiles_and_textures == tile_property_ids.size());

	String previous_texture_name;
	Texture previous_texture;

	for (size_t i = 0; i < num_tiles_and_textures; i++)
	{
		const TilePropertyIds& ids = tile_property_ids[i];

		const Property* src_property = properties.GetProperty(ids.src);
		const String texture_name = src_property->Get<String>();

		// Skip the tile if it has no source name.
		// Declaring the name 'auto' is the same as an empty string. This gives an easy way to skip certain
		// tiles in a shorthand since we can't always declare an empty string.
		if (texture_name.empty() || texture_name == "auto")
			continue;

		// We are required to set default values before instancing the tile, thus, all properties should always be
		// dereferencable. If the debugger captures a zero-dereference, check that all properties for every tile is set
		// and default values are set just before instancing.

		DecoratorTiled::Tile& tile = tiles[i];
		Texture& texture = textures[i];

		const Sprite* sprite = instancer_interface.GetSprite(texture_name);

		// A tile is always either a sprite or an image.
		if (sprite)
		{
			tile.position = sprite->rectangle.Position();
			tile.size = sprite->rectangle.Size();
			tile.display_scale = sprite->sprite_sheet->display_scale;

			texture = sprite->sprite_sheet->texture_source.GetTexture(instancer_interface.GetRenderManager());
		}
		else
		{
			// No sprite found, so assume that the name is an image source. Since the common use case is to specify the
			// same texture for all tiles, check the previous texture first before fetching from the global database.
			if (texture_name == previous_texture_name)
			{
				texture = previous_texture;
			}
			else
			{
				texture = instancer_interface.GetTexture(texture_name);

				if (!texture)
					return false;

				previous_texture_name = texture_name;
				previous_texture = texture;
			}
		}

		if (ids.fit != PropertyId::Invalid)
		{
			RMLUI_ASSERT(ids.align_x != PropertyId::Invalid && ids.align_y != PropertyId::Invalid);
			const Property& fit_property = *properties.GetProperty(ids.fit);
			tile.fit_mode = (DecoratorTiled::TileFitMode)fit_property.value.Get<int>();

			if (sprite &&
				(tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT || tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT_X ||
					tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT_Y))
			{
				Log::Message(Log::LT_WARNING, "Decorator 'fit' value is '%s', which is incompatible with sprites", fit_property.ToString().c_str());
				return false;
			}

			const Property* align_properties[2] = {properties.GetProperty(ids.align_x), properties.GetProperty(ids.align_y)};

			for (int dimension = 0; dimension < 2; dimension++)
			{
				using Style::LengthPercentage;

				LengthPercentage& align = tile.align[dimension];
				const Property& property = *align_properties[dimension];
				if (property.unit == Unit::KEYWORD)
				{
					enum { TOP_LEFT, CENTER, BOTTOM_RIGHT };
					switch (property.Get<int>())
					{
					case TOP_LEFT: align = LengthPercentage(LengthPercentage::Percentage, 0.0f); break;
					case CENTER: align = LengthPercentage(LengthPercentage::Percentage, 50.0f); break;
					case BOTTOM_RIGHT: align = LengthPercentage(LengthPercentage::Percentage, 100.0f); break;
					}
				}
				else if (property.unit == Unit::PERCENT)
				{
					align = LengthPercentage(LengthPercentage::Percentage, property.Get<float>());
				}
				else if (property.unit == Unit::PX)
				{
					align = LengthPercentage(LengthPercentage::Length, property.Get<float>());
				}
				else
				{
					Log::Message(Log::LT_WARNING, "Decorator alignment value is '%s' which uses an unsupported unit (use px, %%, or keyword)",
						property.ToString().c_str());
				}
			}
		}

		if (ids.orientation != PropertyId::Invalid)
		{
			const Property& orientation_property = *properties.GetProperty(ids.orientation);
			tile.orientation = (DecoratorTiled::TileOrientation)orientation_property.value.Get<int>();
		}
	}

	return true;
}